

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O2

bool wipe_doMelt(int ticks)

{
  short *psVar1;
  short *psVar2;
  int *piVar3;
  DFrameBuffer *pDVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  short *psVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  short *psVar15;
  short *psVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  int local_44;
  
  piVar3 = y;
  psVar2 = wipe_scr_end;
  psVar1 = wipe_scr_start;
  bVar5 = true;
  local_44 = ticks;
  do {
    pDVar4 = screen;
    bVar19 = local_44 == 0;
    local_44 = local_44 + -1;
    if (bVar19) {
      return bVar5;
    }
    bVar5 = true;
    for (lVar9 = 0; lVar9 != 0xa0; lVar9 = lVar9 + 1) {
      uVar7 = piVar3[lVar9];
      if ((int)uVar7 < 0) {
        uVar7 = uVar7 + 1;
LAB_0039dcaa:
        piVar3[lVar9] = uVar7;
        bVar5 = false;
      }
      else if (uVar7 < 200) {
        iVar6 = uVar7 + 1;
        if (0xf < uVar7) {
          iVar6 = 8;
        }
        uVar7 = iVar6 + uVar7;
        if (199 < uVar7) {
          uVar7 = 200;
        }
        goto LAB_0039dcaa;
      }
      if ((local_44 == 0) && (-1 < (int)uVar7)) {
        iVar12 = (pDVar4->super_DSimpleCanvas).super_DCanvas.Pitch / 2;
        iVar6 = (pDVar4->super_DSimpleCanvas).super_DCanvas.Height;
        lVar18 = (long)iVar6;
        iVar11 = (int)(uVar7 * iVar6) / 200;
        iVar8 = (pDVar4->super_DSimpleCanvas).super_DCanvas.Width / 2;
        lVar13 = (long)((iVar8 * (int)lVar9) / 0xa0);
        lVar14 = lVar18 * 2 * lVar13;
        psVar10 = (short *)((long)psVar2 + lVar14);
        lVar17 = lVar13 * 2;
        psVar15 = (short *)(lVar14 + (long)psVar1);
        for (; lVar13 < (((int)lVar9 + 1) * iVar8) / 0xa0; lVar13 = lVar13 + 1) {
          psVar16 = (short *)((pDVar4->super_DSimpleCanvas).super_DCanvas.Buffer + lVar17);
          for (lVar14 = 0; iVar11 != (int)lVar14; lVar14 = lVar14 + 1) {
            *psVar16 = psVar10[lVar14];
            psVar16 = psVar16 + iVar12;
          }
          for (lVar14 = 0; iVar6 - iVar11 != (int)lVar14; lVar14 = lVar14 + 1) {
            *psVar16 = psVar15[lVar14];
            psVar16 = psVar16 + iVar12;
          }
          psVar10 = psVar10 + lVar18;
          lVar17 = lVar17 + 2;
          psVar15 = psVar15 + lVar18;
        }
      }
    }
  } while( true );
}

Assistant:

bool wipe_doMelt (int ticks)
{
	int i, j, dy, x;
	const short *s;
	short *d;
	bool done = true;

	while (ticks--)
	{
		done = true;
		for (i = 0; i < MELT_WIDTH; i++)
		{
			if (y[i] < 0)
			{
				y[i]++;
				done = false;
			} 
			else if (y[i] < MELT_HEIGHT)
			{
				dy = (y[i] < 16) ? y[i]+1 : 8;
				y[i] = MIN(y[i] + dy, MELT_HEIGHT);
				done = false;
			}
			if (ticks == 0 && y[i] >= 0)
			{ // Only draw for the final tick.
				const int pitch = screen->GetPitch() / 2;
				int sy = y[i] * SCREENHEIGHT / MELT_HEIGHT;

				for (x = i * (SCREENWIDTH/2) / MELT_WIDTH; x < (i + 1) * (SCREENWIDTH/2) / MELT_WIDTH; ++x)
				{
					s = &wipe_scr_end[x*SCREENHEIGHT];
					d = &((short *)screen->GetBuffer())[x];

					for (j = sy; j != 0; --j)
					{
						*d = *(s++);
						d += pitch;
					}

					s = &wipe_scr_start[x*SCREENHEIGHT];

					for (j = SCREENHEIGHT - sy; j != 0; --j)
					{
						*d = *(s++);
						d += pitch;
					}
				}
			}
		}
	}

	return done;
}